

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

void __thiscall
cmDocumentation::SetSections
          (cmDocumentation *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>_>
          *sections)

{
  _Base_ptr *pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *name;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  cmDocumentationSection local_68;
  
  p_Var3 = (sections->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(sections->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    paVar2 = &local_68.Name.field_2;
    do {
      name = *(char **)(p_Var3 + 1);
      pp_Var1 = &p_Var3[2]._M_left;
      if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)(p_Var3 + 2) ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pp_Var1) {
        local_68.Name.field_2._M_allocated_capacity = (size_type)*pp_Var1;
        local_68.Name.field_2._8_8_ = p_Var3[2]._M_right;
        local_68.Name._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_68.Name.field_2._M_allocated_capacity = (size_type)*pp_Var1;
        local_68.Name._M_dataplus._M_p =
             (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)(p_Var3 + 2);
      }
      local_68.Name._M_string_length = (size_type)p_Var3[2]._M_parent;
      *(_Base_ptr **)(p_Var3 + 2) = pp_Var1;
      p_Var3[2]._M_parent = (_Base_ptr)0x0;
      *(undefined1 *)&p_Var3[2]._M_left = 0;
      local_68.Entries.
      super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)(p_Var3 + 3);
      local_68.Entries.
      super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)p_Var3[3]._M_parent;
      local_68.Entries.
      super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)p_Var3[3]._M_left;
      p_Var3[3]._M_left = (_Base_ptr)0x0;
      *(undefined8 *)(p_Var3 + 3) = 0;
      p_Var3[3]._M_parent = (_Base_ptr)0x0;
      SetSection(this,name,&local_68);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
                (&local_68.Entries);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.Name._M_dataplus._M_p != paVar2) {
        operator_delete(local_68.Name._M_dataplus._M_p,
                        (ulong)(local_68.Name.field_2._M_allocated_capacity + 1));
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

void cmDocumentation::SetSections(
  std::map<std::string, cmDocumentationSection> sections)
{
  for (auto& s : sections) {
    this->SetSection(s.first.c_str(), std::move(s.second));
  }
}